

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::VisitDescriptorsTest_SingleTypeWithProto_Test::
VisitDescriptorsTest_SingleTypeWithProto_Test(VisitDescriptorsTest_SingleTypeWithProto_Test *this)

{
  VisitDescriptorsTest_SingleTypeWithProto_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__VisitDescriptorsTest_SingleTypeWithProto_Test_029bc360;
  return;
}

Assistant:

TEST(VisitDescriptorsTest, SingleTypeWithProto) {
  const FileDescriptor& file =
      *proto2_unittest::TestAllTypes::GetDescriptor()->file();
  FileDescriptorProto proto;
  file.CopyTo(&proto);
  std::vector<absl::string_view> descriptors;
  VisitDescriptors(
      file, proto,
      [&](const Descriptor& descriptor, const DescriptorProto& proto) {
        descriptors.push_back(descriptor.full_name());
        EXPECT_EQ(descriptor.name(), proto.name());
      });
  EXPECT_THAT(descriptors,
              IsSupersetOf({"proto2_unittest.TestAllTypes",
                            "proto2_unittest.TestAllTypes.NestedMessage"}));
}